

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeadersConfig.h
# Opt level: O1

void __thiscall
jaegertracing::propagation::HeadersConfig::HeadersConfig
          (HeadersConfig *this,string *jaegerDebugHeader,string *jaegerBaggageHeader,
          string *traceContextHeaderName,string *traceBaggageHeaderPrefix)

{
  size_type sVar1;
  pointer pcVar2;
  
  sVar1 = jaegerDebugHeader->_M_string_length;
  (this->_jaegerDebugHeader)._M_dataplus._M_p = (pointer)&(this->_jaegerDebugHeader).field_2;
  if (sVar1 == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)this,"jaeger-debug-id","");
  }
  else {
    pcVar2 = (jaegerDebugHeader->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>((string *)this,pcVar2,pcVar2 + sVar1);
  }
  sVar1 = jaegerBaggageHeader->_M_string_length;
  (this->_jaegerBaggageHeader)._M_dataplus._M_p = (pointer)&(this->_jaegerBaggageHeader).field_2;
  if (sVar1 == 0) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&this->_jaegerBaggageHeader,"jaeger-baggage","");
  }
  else {
    pcVar2 = (jaegerBaggageHeader->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&this->_jaegerBaggageHeader,pcVar2,pcVar2 + sVar1);
  }
  sVar1 = traceContextHeaderName->_M_string_length;
  (this->_traceContextHeaderName)._M_dataplus._M_p =
       (pointer)&(this->_traceContextHeaderName).field_2;
  if (sVar1 == 0) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&this->_traceContextHeaderName,"uber-trace-id","");
  }
  else {
    pcVar2 = (traceContextHeaderName->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&this->_traceContextHeaderName,pcVar2,pcVar2 + sVar1);
  }
  sVar1 = traceBaggageHeaderPrefix->_M_string_length;
  (this->_traceBaggageHeaderPrefix)._M_dataplus._M_p =
       (pointer)&(this->_traceBaggageHeaderPrefix).field_2;
  if (sVar1 == 0) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&this->_traceBaggageHeaderPrefix,"uberctx-","");
  }
  else {
    pcVar2 = (traceBaggageHeaderPrefix->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&this->_traceBaggageHeaderPrefix,pcVar2,pcVar2 + sVar1);
  }
  return;
}

Assistant:

HeadersConfig(const std::string& jaegerDebugHeader,
                  const std::string& jaegerBaggageHeader,
                  const std::string& traceContextHeaderName,
                  const std::string& traceBaggageHeaderPrefix)
        : _jaegerDebugHeader(jaegerDebugHeader.empty() ? kJaegerDebugHeader
                                                       : jaegerDebugHeader)
        , _jaegerBaggageHeader(jaegerBaggageHeader.empty()
                                   ? kJaegerBaggageHeader
                                   : jaegerBaggageHeader)
        , _traceContextHeaderName(traceContextHeaderName.empty()
                                      ? kTraceContextHeaderName
                                      : traceContextHeaderName)
        , _traceBaggageHeaderPrefix(traceBaggageHeaderPrefix.empty()
                                        ? kTraceBaggageHeaderPrefix
                                        : traceBaggageHeaderPrefix)
    {
    }